

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void __thiscall
es::init::details_static_instances_counting::InstancesCounterZeroActivated<es::init::ActionOnZero>::
~InstancesCounterZeroActivated(InstancesCounterZeroActivated<es::init::ActionOnZero> *this)

{
  ostream *poVar1;
  ActionOnZero local_1;
  
  LOCK();
  global_static_instances_counter = global_static_instances_counter + -1;
  UNLOCK();
  if (global_static_instances_counter == 0) {
    ActionOnZero::operator()(&local_1);
  }
  else if (global_static_instances_counter < 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: negative static counter:");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

~InstancesCounterZeroActivated() noexcept
    {
        if (--global_static_instances_counter == 0)
        {
            F{}();
            return;
        }
        if (global_static_instances_counter < 0)
        {
            std::cerr << "Error: negative static counter:" << global_static_instances_counter << std::endl;
        }
    }